

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O1

wchar_t __thiscall CharConvUTF8::readch(CharConvUTF8 *this,CVmDataSource *src)

{
  int iVar1;
  uint uVar2;
  wchar_t wVar3;
  uint ch;
  char buf [10];
  byte local_12;
  undefined1 local_11 [9];
  
  iVar1 = (*src->_vptr_CVmDataSource[2])(src,&local_12,1);
  if (iVar1 == 0) {
    uVar2 = ((local_12 >> 5 & 1) != 0) + 1 & (uint)(local_12 >> 7) * 3;
    if (uVar2 != 0) {
      iVar1 = (*src->_vptr_CVmDataSource[2])(src,local_11,(ulong)uVar2);
      if (iVar1 != 0) goto LAB_002b33cd;
    }
    wVar3 = utf8_ptr::s_getch((char *)&local_12);
    return wVar3;
  }
LAB_002b33cd:
  err_throw(0x65);
}

Assistant:

virtual wchar_t readch(CVmDataSource *src)
    {
        /* read the first byte */
        char buf[10];
        if (src->read(buf, 1))
            err_throw(VMERR_READ_FILE);

        /* figure how many more bytes we have to read */
        size_t len = utf8_ptr::s_charsize(buf[0]);
        if (len > sizeof(buf))
            len = sizeof(buf);

        /* read the rest of the bytes */
        if (len > 1 && src->read(buf+1, len-1))
            err_throw(VMERR_READ_FILE);

        /* return the translated character */
        return utf8_ptr::s_getch(buf);
    }